

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O2

void add_file_if_regex_ok(regex *r,list<int,_std::allocator<int>_> *file_list,string *file_name)

{
  int in_no;
  string in_file;
  
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&in_file,file_name,r,"$1",0);
  in_no = std::__cxx11::stoi(&in_file,(size_t *)0x0,10);
  std::__cxx11::list<int,_std::allocator<int>_>::push_back(file_list,&in_no);
  std::__cxx11::string::~string((string *)&in_file);
  return;
}

Assistant:

void add_file_if_regex_ok(const regex &r, list<int> &file_list, const string &file_name) {
    string in_file = regex_replace(file_name, r, "$1");

    // NOTE: If the regex did not find anything, the original string is passed on to in_file
    //       -> With stoi, this should be handled with the exception catching
    try {
        int in_no = stoi(in_file);
        file_list.push_back(in_no);
    }
    catch (exception &e) {
        // Do nothing
    }
}